

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Fts5Cursor *in_RDI;
  long in_FS_OFFSET;
  Fts5Config *pConfig;
  int rc;
  Fts5Cursor *pCsr;
  int bSkip;
  Fts5Expr *in_stack_ffffffffffffffd0;
  Fts5Hash *pFVar4;
  uint in_stack_ffffffffffffffd8;
  Fts5Cursor *pbSkip;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar5;
  sqlite3_stmt *pStmt;
  
  pStmt = *(sqlite3_stmt **)(in_FS_OFFSET + 0x28);
  pbSkip = in_RDI;
  if ((in_RDI->ePlan == 1) &&
     (*(int *)((long)&((Fts5Index *)(in_RDI->base).pVtab)->pHash[2].pScan + 4) != 0)) {
    sqlite3Fts5ExprClearTokens(in_stack_ffffffffffffffd0);
  }
  if (in_RDI->ePlan < 3) {
    iVar5 = 0;
    iVar1 = fts5CursorReseek((Fts5Cursor *)(ulong)in_stack_fffffffffffffff0,(int *)pbSkip);
    if ((iVar1 == 0) && (iVar5 == 0)) {
      iVar1 = sqlite3Fts5ExprNext((Fts5Expr *)in_RDI,(ulong)in_stack_ffffffffffffffd8);
      uVar2 = sqlite3Fts5ExprEof(in_RDI->pExpr);
      in_RDI->csrflags = uVar2 | in_RDI->csrflags;
      fts5CsrNewrow(in_RDI);
    }
  }
  else if (in_RDI->ePlan == 3) {
    in_RDI->csrflags = in_RDI->csrflags | 1;
    iVar1 = 0;
  }
  else if (in_RDI->ePlan == 4) {
    iVar1 = fts5SorterNext((Fts5Cursor *)
                           CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  else {
    pFVar4 = ((Fts5Index *)(pbSkip->base).pVtab)->pHash;
    *(int *)&pFVar4[4].pScan = *(int *)&pFVar4[4].pScan + 1;
    iVar1 = sqlite3_step(pStmt);
    *(int *)&pFVar4[4].pScan = *(int *)&pFVar4[4].pScan + -1;
    if (iVar1 == 100) {
      iVar1 = 0;
      in_RDI->csrflags = in_RDI->csrflags | 4;
    }
    else {
      in_RDI->csrflags = in_RDI->csrflags | 1;
      iVar1 = sqlite3_reset((sqlite3_stmt *)in_RDI);
      if (iVar1 != 0) {
        pcVar3 = sqlite3_errmsg((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
        pcVar3 = sqlite3_mprintf("%s",pcVar3);
        *(char **)&((Fts5Index *)(pbSkip->base).pVtab)->nWorkUnit = pcVar3;
      }
    }
  }
  if (*(sqlite3_stmt **)(in_FS_OFFSET + 0x28) != pStmt) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE)
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  /* If this cursor uses FTS5_PLAN_MATCH and this is a tokendata=1 table,
  ** clear any token mappings accumulated at the fts5_index.c level. In
  ** other cases, specifically FTS5_PLAN_SOURCE and FTS5_PLAN_SORTED_MATCH,
  ** we need to retain the mappings for the entire query.  */
  if( pCsr->ePlan==FTS5_PLAN_MATCH
   && ((Fts5Table*)pCursor->pVtab)->pConfig->bTokendata
  ){
    sqlite3Fts5ExprClearTokens(pCsr->pExpr);
  }

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }

      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }

      default: {
        Fts5Config *pConfig = ((Fts5Table*)pCursor->pVtab)->pConfig;
        pConfig->bLock++;
        rc = sqlite3_step(pCsr->pStmt);
        pConfig->bLock--;
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
          if( rc!=SQLITE_OK ){
            pCursor->pVtab->zErrMsg = sqlite3_mprintf(
                "%s", sqlite3_errmsg(pConfig->db)
            );
          }
        }else{
          rc = SQLITE_OK;
          CsrFlagSet(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
        }
        break;
      }
    }
  }

  return rc;
}